

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::MergeFrom
          (BayesianProbitRegressor_Gaussian *this,BayesianProbitRegressor_Gaussian *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x10d);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->mean_ != 0.0) {
    this->mean_ = from->mean_;
  }
  if (from->precision_ != 0.0) {
    this->precision_ = from->precision_;
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void BayesianProbitRegressor_Gaussian::MergeFrom(const BayesianProbitRegressor_Gaussian& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BayesianProbitRegressor.Gaussian)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_mean = from._internal_mean();
  uint64_t raw_mean;
  memcpy(&raw_mean, &tmp_mean, sizeof(tmp_mean));
  if (raw_mean != 0) {
    _internal_set_mean(from._internal_mean());
  }
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_precision = from._internal_precision();
  uint64_t raw_precision;
  memcpy(&raw_precision, &tmp_precision, sizeof(tmp_precision));
  if (raw_precision != 0) {
    _internal_set_precision(from._internal_precision());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}